

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

CheckerSymbol * slang::ast::CheckerSymbol::fromSyntax(Scope *scope,CheckerDeclarationSyntax *syntax)

{
  SyntaxKind SVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  bool bVar2;
  int iVar3;
  Type *newType;
  AssertionItemPortSyntax *node;
  AssertionPortSymbol *this;
  DataTypeSyntax *newType_00;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  iterator iVar4;
  iterator iVar5;
  SourceRange SVar6;
  SyntaxKind itemKind;
  AssertionPortSymbol *port;
  AssertionItemPortSyntax *item;
  iterator __end3;
  iterator __begin3;
  SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *__range3;
  ArgumentDirection lastDir;
  DataTypeSyntax *lastType;
  Type *untyped;
  SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL> ports;
  CheckerSymbol *result;
  Compilation *comp;
  SyntaxNode *in_stack_00000338;
  Scope *in_stack_00000340;
  Symbol *in_stack_fffffffffffffcd8;
  Scope *in_stack_fffffffffffffce0;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffce8;
  Token *in_stack_fffffffffffffcf0;
  DeclaredType *in_stack_fffffffffffffcf8;
  Type *in_stack_fffffffffffffd00;
  SourceLocation in_stack_fffffffffffffd08;
  SourceLocation in_stack_fffffffffffffd10;
  Scope *in_stack_fffffffffffffd18;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2c;
  undefined1 in_stack_fffffffffffffd2d;
  undefined1 in_stack_fffffffffffffd2e;
  undefined1 in_stack_fffffffffffffd2f;
  Compilation *in_stack_fffffffffffffd30;
  size_t local_1f0;
  Scope *this_00;
  Type *pTVar7;
  pointer local_198;
  size_t local_190;
  _Optional_payload_base<slang::ast::ArgumentDirection> local_13c;
  _Optional_payload_base<slang::ast::ArgumentDirection> local_130;
  DataTypeSyntax *local_a8;
  SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> local_88 [2];
  SourceLocation local_38;
  string_view local_30;
  CheckerSymbol *local_20;
  Compilation *local_18;
  SyntaxNode *local_10;
  Scope *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = Scope::getCompilation(in_RDI);
  local_30 = parsing::Token::valueText(in_stack_fffffffffffffcf0);
  local_38 = parsing::Token::location((Token *)(local_10 + 4));
  local_20 = BumpAllocator::
             emplace<slang::ast::CheckerSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                       ((BumpAllocator *)in_stack_fffffffffffffd10,
                        (Compilation *)in_stack_fffffffffffffd08,
                        (basic_string_view<char,_std::char_traits<char>_> *)
                        in_stack_fffffffffffffd00,(SourceLocation *)in_stack_fffffffffffffcf8);
  Symbol::setSyntax(&local_20->super_Symbol,local_10);
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  syntax_00._M_extent._M_extent_value = in_stack_fffffffffffffd20._M_extent_value;
  syntax_00._M_ptr = (pointer)in_stack_fffffffffffffd18;
  Symbol::setAttributes
            ((Symbol *)in_stack_fffffffffffffd10,(Scope *)in_stack_fffffffffffffd08,syntax_00);
  SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL> *)0x3a4873);
  src = extraout_RDX;
  if (local_10[4].previewNode != (SyntaxNode *)0x0) {
    newType = Compilation::getType
                        (in_stack_fffffffffffffd30,
                         CONCAT13(in_stack_fffffffffffffd2f,
                                  CONCAT12(in_stack_fffffffffffffd2e,
                                           CONCAT11(in_stack_fffffffffffffd2d,
                                                    in_stack_fffffffffffffd2c))));
    local_a8 = (DataTypeSyntax *)0x0;
    pTVar7 = newType;
    iVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::begin
                      ((SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *)0x3a48ee);
    iVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::end
                      ((SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *)
                       in_stack_fffffffffffffce0);
    SVar6.endLoc = in_stack_fffffffffffffd08;
    SVar6.startLoc = in_stack_fffffffffffffd10;
    while( true ) {
      local_1f0 = iVar5.index;
      this_00 = (Scope *)iVar5.list;
      bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::iterator_base<slang::syntax::AssertionItemPortSyntax_*>_>
                        ((self_type *)in_stack_fffffffffffffce0,
                         (iterator_base<slang::syntax::AssertionItemPortSyntax_*> *)
                         in_stack_fffffffffffffcd8);
      src = extraout_RDX_00;
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      node = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::iterator_base<slang::syntax::AssertionItemPortSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::iterator_base<slang::syntax::AssertionItemPortSyntax_*>,_false>
                          *)0x3a499c);
      if ((node->super_SyntaxNode).previewNode != (SyntaxNode *)0x0) {
        Scope::addMembers(in_stack_00000340,in_stack_00000338);
      }
      parsing::Token::valueText(in_stack_fffffffffffffcf0);
      parsing::Token::location(&node->name);
      this = BumpAllocator::
             emplace<slang::ast::AssertionPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                       ((BumpAllocator *)in_stack_fffffffffffffd00,
                        (basic_string_view<char,_std::char_traits<char>_> *)
                        in_stack_fffffffffffffcf8,(SourceLocation *)in_stack_fffffffffffffcf0);
      Symbol::setSyntax(&this->super_Symbol,&node->super_SyntaxNode);
      std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
      span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                  *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      syntax_01._M_extent._M_extent_value = in_stack_fffffffffffffd20._M_extent_value;
      syntax_01._M_ptr = (pointer)in_stack_fffffffffffffd18;
      Symbol::setAttributes((Symbol *)SVar6.startLoc,(Scope *)SVar6.endLoc,syntax_01);
      bVar2 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                        ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                         0x3a4b50);
      if (!bVar2) {
        DeclaredType::setDimensionSyntax(&this->declaredType,&node->dimensions);
      }
      bVar2 = parsing::Token::operator_cast_to_bool((Token *)0x3a4b89);
      if (bVar2) {
        parsing::Token::range((Token *)in_stack_fffffffffffffd00);
        sourceRange.endLoc = (SourceLocation)iVar4.list;
        sourceRange.startLoc = (SourceLocation)iVar4.index;
        Scope::addDiag(this_00,SUB84((ulong)pTVar7 >> 0x20,0),sourceRange);
      }
      bVar2 = parsing::Token::operator_cast_to_bool((Token *)0x3a4c39);
      if (bVar2) {
        SemanticFacts::getDirection((node->direction).kind);
        std::optional<slang::ast::ArgumentDirection>::optional<slang::ast::ArgumentDirection,_true>
                  ((optional<slang::ast::ArgumentDirection> *)in_stack_fffffffffffffce0,
                   &in_stack_fffffffffffffcd8->kind);
        (this->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload
        .super__Optional_payload_base<slang::ast::ArgumentDirection> = local_130;
        local_a8 = (DataTypeSyntax *)0x0;
      }
      else {
        std::optional<slang::ast::ArgumentDirection>::
        optional<slang::ast::ArgumentDirection_&,_true>
                  ((optional<slang::ast::ArgumentDirection> *)in_stack_fffffffffffffce0,
                   &in_stack_fffffffffffffcd8->kind);
        (this->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload
        .super__Optional_payload_base<slang::ast::ArgumentDirection> = local_13c;
      }
      not_null<slang::syntax::DataTypeSyntax_*>::operator*
                ((not_null<slang::syntax::DataTypeSyntax_*> *)0x3a4cee);
      bVar2 = isEmptyType((DataTypeSyntax *)in_stack_fffffffffffffce8);
      if (bVar2) {
        if (local_a8 == (DataTypeSyntax *)0x0) {
          DeclaredType::setType(&this->declaredType,newType);
          bVar2 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                            ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
                              *)0x3a4d7c);
          if (!bVar2) {
            slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffd30);
            sourceRange_00.endLoc = (SourceLocation)iVar4.list;
            sourceRange_00.startLoc = (SourceLocation)iVar4.index;
            Scope::addDiag(this_00,SUB84((ulong)pTVar7 >> 0x20,0),sourceRange_00);
            ast::operator<<((Diagnostic *)in_stack_fffffffffffffd30,
                            (Type *)CONCAT17(in_stack_fffffffffffffd2f,
                                             CONCAT16(in_stack_fffffffffffffd2e,
                                                      CONCAT15(in_stack_fffffffffffffd2d,
                                                               CONCAT14(in_stack_fffffffffffffd2c,
                                                                        in_stack_fffffffffffffd28)))
                                            ));
          }
          bVar2 = parsing::Token::operator_cast_to_bool((Token *)0x3a4e3d);
          if (bVar2) {
            parsing::Token::range((Token *)in_stack_fffffffffffffd00);
            sourceRange_01.endLoc = (SourceLocation)iVar4.list;
            sourceRange_01.startLoc = (SourceLocation)iVar4.index;
            Scope::addDiag(this_00,SUB84((ulong)pTVar7 >> 0x20,0),sourceRange_01);
          }
        }
        else {
          DeclaredType::setTypeSyntax(&this->declaredType,local_a8);
        }
      }
      else {
        newType_00 = not_null<slang::syntax::DataTypeSyntax_*>::operator*
                               ((not_null<slang::syntax::DataTypeSyntax_*> *)0x3a4eff);
        DeclaredType::setTypeSyntax(&this->declaredType,newType_00);
        local_a8 = not_null::operator_cast_to_DataTypeSyntax_
                             ((not_null<slang::syntax::DataTypeSyntax_*> *)0x3a4f28);
        in_stack_fffffffffffffd30 =
             (Compilation *)
             not_null<slang::syntax::DataTypeSyntax_*>::operator->
                       ((not_null<slang::syntax::DataTypeSyntax_*> *)0x3a4f4d);
        SVar1 = (((ExpressionSyntax *)&in_stack_fffffffffffffd30->super_BumpAllocator)->
                super_SyntaxNode).kind;
        in_stack_fffffffffffffd2f =
             std::operator==((optional<slang::ast::ArgumentDirection> *)in_stack_fffffffffffffce0,
                             &in_stack_fffffffffffffcd8->kind);
        in_stack_fffffffffffffd2e = false;
        if ((((bool)in_stack_fffffffffffffd2f) &&
            (in_stack_fffffffffffffd2d = true, in_stack_fffffffffffffd2e = in_stack_fffffffffffffd2d
            , SVar1 != PropertyType)) &&
           (in_stack_fffffffffffffd2d = true, in_stack_fffffffffffffd2e = in_stack_fffffffffffffd2d,
           SVar1 != SequenceType)) {
          in_stack_fffffffffffffd2d = SVar1 == Untyped;
          in_stack_fffffffffffffd2e = in_stack_fffffffffffffd2d;
        }
        if ((bool)in_stack_fffffffffffffd2e != false) {
          in_stack_fffffffffffffd18 = local_8;
          in_stack_fffffffffffffd20._M_extent_value =
               (size_t)not_null<slang::syntax::DataTypeSyntax_*>::operator->
                                 ((not_null<slang::syntax::DataTypeSyntax_*> *)0x3a5016);
          SVar6 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffd30);
          sourceRange_02.endLoc = (SourceLocation)iVar4.list;
          sourceRange_02.startLoc = (SourceLocation)iVar4.index;
          Scope::addDiag(this_00,SUB84((ulong)pTVar7 >> 0x20,0),sourceRange_02);
          in_stack_fffffffffffffcf8 = &this->declaredType;
          in_stack_fffffffffffffd00 = Compilation::getErrorType(local_18);
          DeclaredType::setType(in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00);
        }
      }
      std::optional<slang::ast::ArgumentDirection>::operator*
                ((optional<slang::ast::ArgumentDirection> *)0x3a50be);
      if (node->defaultValue != (EqualsAssertionArgClauseSyntax *)0x0) {
        in_stack_fffffffffffffcf0 =
             (Token *)not_null::operator_cast_to_PropertyExprSyntax_
                                ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x3a50f1);
        this->defaultValueSyntax = (PropertyExprSyntax *)in_stack_fffffffffffffcf0;
      }
      Scope::addMember(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      SmallVectorBase<const_slang::ast::AssertionPortSymbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> *)
                 in_stack_fffffffffffffce0,(AssertionPortSymbol **)in_stack_fffffffffffffcd8);
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::iterator_base<slang::syntax::AssertionItemPortSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::iterator_base<slang::syntax::AssertionItemPortSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax>::iterator_base<slang::syntax::AssertionItemPortSyntax_*>,_false>
                  *)in_stack_fffffffffffffce0);
      iVar5.index = local_1f0;
      iVar5.list = (ParentList *)this_00;
    }
  }
  iVar3 = SmallVectorBase<const_slang::ast::AssertionPortSymbol_*>::copy
                    (local_88,(EVP_PKEY_CTX *)local_18,src);
  std::span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::AssertionPortSymbol_*,_18446744073709551615UL>
            ((span<const_slang::ast::AssertionPortSymbol_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffcf0,
             (span<const_slang::ast::AssertionPortSymbol_*,_18446744073709551615UL> *)
             CONCAT44(extraout_var,iVar3));
  (local_20->ports)._M_ptr = local_198;
  (local_20->ports)._M_extent._M_extent_value = local_190;
  SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL> *)0x3a51e2);
  return local_20;
}

Assistant:

CheckerSymbol& CheckerSymbol::fromSyntax(const Scope& scope,
                                         const CheckerDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CheckerSymbol>(comp, syntax.name.valueText(),
                                              syntax.name.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    SmallVector<const AssertionPortSymbol*> ports;
    if (syntax.portList) {
        // Checker port symbols differ enough in their rules that we
        // don't try to reuse buildPorts here.
        auto& untyped = comp.getType(SyntaxKind::Untyped);
        const DataTypeSyntax* lastType = nullptr;
        ArgumentDirection lastDir = ArgumentDirection::In;

        for (auto item : syntax.portList->ports) {
            if (item->previewNode)
                result->addMembers(*item->previewNode);

            auto port = comp.emplace<AssertionPortSymbol>(item->name.valueText(),
                                                          item->name.location());
            port->setSyntax(*item);
            port->setAttributes(scope, item->attributes);

            if (!item->dimensions.empty())
                port->declaredType.setDimensionSyntax(item->dimensions);

            if (item->local)
                scope.addDiag(diag::LocalNotAllowed, item->local.range());

            if (item->direction) {
                port->direction = SemanticFacts::getDirection(item->direction.kind);

                // If we have a direction we can never inherit the previous type.
                lastType = nullptr;
            }
            else {
                port->direction = lastDir;
            }

            if (isEmptyType(*item->type)) {
                if (lastType)
                    port->declaredType.setTypeSyntax(*lastType);
                else {
                    port->declaredType.setType(untyped);
                    if (!item->dimensions.empty()) {
                        scope.addDiag(diag::InvalidArrayElemType, item->dimensions.sourceRange())
                            << untyped;
                    }

                    if (item->direction)
                        scope.addDiag(diag::CheckerPortDirectionType, item->direction.range());
                }
            }
            else {
                port->declaredType.setTypeSyntax(*item->type);
                lastType = item->type;

                auto itemKind = item->type->kind;
                if (port->direction == ArgumentDirection::Out &&
                    (itemKind == SyntaxKind::PropertyType || itemKind == SyntaxKind::SequenceType ||
                     itemKind == SyntaxKind::Untyped)) {
                    scope.addDiag(diag::CheckerOutputBadType, item->type->sourceRange());
                    port->declaredType.setType(comp.getErrorType());
                }
            }

            lastDir = *port->direction;
            if (item->defaultValue)
                port->defaultValueSyntax = item->defaultValue->expr;

            result->addMember(*port);
            ports.push_back(port);
        }
    }
    result->ports = ports.copy(comp);

    return *result;
}